

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sid.cc
# Opt level: O0

int __thiscall SID::clock_fast(SID *this,cycle_count *delta_t,short *buf,int n,int interleave)

{
  uint uVar1;
  int iVar2;
  int in_ECX;
  long in_RDX;
  int *in_RSI;
  SID *in_RDI;
  int in_R8D;
  cycle_count delta_t_sample;
  cycle_count next_sample_offset;
  int s;
  undefined4 in_stack_ffffffffffffffc8;
  int local_2c;
  
  local_2c = 0;
  while( true ) {
    uVar1 = in_RDI->sample_offset + in_RDI->cycles_per_sample + 0x8000;
    iVar2 = (int)uVar1 >> 0x10;
    if (*in_RSI < iVar2) {
      clock(in_RDI);
      in_RDI->sample_offset = in_RDI->sample_offset + *in_RSI * -0x10000;
      *in_RSI = 0;
      return local_2c;
    }
    if (in_ECX <= local_2c) break;
    clock(in_RDI);
    *in_RSI = *in_RSI - iVar2;
    in_RDI->sample_offset = (uVar1 & 0xffff) - 0x8000;
    iVar2 = output((SID *)CONCAT44(iVar2,in_stack_ffffffffffffffc8));
    *(short *)(in_RDX + (long)(local_2c * in_R8D) * 2) = (short)iVar2;
    local_2c = local_2c + 1;
  }
  return local_2c;
}

Assistant:

RESID_INLINE
int SID::clock_fast(cycle_count& delta_t, short* buf, int n,
		    int interleave)
{
  int s = 0;

  for (;;) {
    cycle_count next_sample_offset = sample_offset + cycles_per_sample + (1 << (FIXP_SHIFT - 1));
    cycle_count delta_t_sample = next_sample_offset >> FIXP_SHIFT;
    if (delta_t_sample > delta_t) {
      break;
    }
    if (s >= n) {
      return s;
    }
    clock(delta_t_sample);
    delta_t -= delta_t_sample;
    sample_offset = (next_sample_offset & FIXP_MASK) - (1 << (FIXP_SHIFT - 1));
    buf[s++*interleave] = output();
  }

  clock(delta_t);
  sample_offset -= delta_t << FIXP_SHIFT;
  delta_t = 0;
  return s;
}